

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledBitmap.h
# Opt level: O0

bool __thiscall SSD1306::OledBitmap<128,_64>::isSetPixel(OledBitmap<128,_64> *this,OledPoint p)

{
  OledPoint p_00;
  bool bVar1;
  byte *pbVar2;
  OledPoint in_RDI;
  PixelOffset offset;
  PixelOffset *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  byte bVar3;
  int in_stack_ffffffffffffffd4;
  undefined1 local_1;
  
  p_00.m_y = in_stack_ffffffffffffffd4;
  p_00.m_x = in_stack_ffffffffffffffd0;
  bVar1 = OledPixel::pixelInside
                    ((OledPixel *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),p_00
                    );
  bVar3 = (byte)in_stack_ffffffffffffffd4;
  if (bVar1) {
    PixelOffset::PixelOffset(in_stack_ffffffffffffffb8,in_RDI);
    std::array<std::array<unsigned_char,_16UL>,_64UL>::operator[]
              ((array<std::array<unsigned_char,_16UL>,_64UL> *)in_RDI,
               (size_type)in_stack_ffffffffffffffb8);
    pbVar2 = std::array<unsigned_char,_16UL>::operator[]
                       ((array<unsigned_char,_16UL> *)in_RDI,(size_type)in_stack_ffffffffffffffb8);
    local_1 = ((uint)*pbVar2 & 1 << (bVar3 & 0x1f)) != 0;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
    isSetPixel(
        SSD1306::OledPoint p) const override
    {
        if (not pixelInside(p))
        {
            return false;
        }

        PixelOffset offset{p};

        return blocks_[offset.block][offset.byte] & (1 << offset.bit);
    }